

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
TestCharReaderAllowDropNullTestissue178::runTestCase(TestCharReaderAllowDropNullTestissue178 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestResult *pTVar2;
  int iVar3;
  ArrayIndex AVar4;
  Value *pVVar5;
  CharReader *pCVar6;
  string errs;
  char doc_2 [3];
  char doc [16];
  Value root;
  CharReaderBuilder b;
  undefined1 *local_220;
  long local_218;
  undefined1 local_210 [16];
  ValueHolder local_200;
  undefined1 local_1f8 [8];
  undefined1 local_1f0 [24];
  string local_1d8;
  undefined8 local_1b8;
  uint uStack_1b0;
  char acStack_1ac [12];
  Value local_1a0;
  CharReaderBuilder local_178;
  Value local_148;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  Json::CharReaderBuilder::CharReaderBuilder(&local_178);
  Json::Value::Value(&local_58,true);
  pVVar5 = Json::Value::operator[](&local_178.settings_,"allowDroppedNullPlaceholders");
  Json::Value::operator=(pVVar5,&local_58);
  Json::Value::~Value(&local_58);
  Json::Value::Value(&local_1a0,nullValue);
  local_220 = local_210;
  local_218 = 0;
  local_210[0] = 0;
  pCVar6 = Json::CharReaderBuilder::newCharReader(&local_178);
  local_1b8 = 0x62222c3a2261227b;
  uStack_1b0._0_1_ = '\"';
  uStack_1b0._1_1_ = ':';
  uStack_1b0._2_1_ = 't';
  uStack_1b0._3_1_ = 'r';
  builtin_strncpy(acStack_1ac,"ue}",4);
  iVar3 = (*pCVar6->_vptr_CharReader[2])(pCVar6,&local_1b8,acStack_1ac + 3,&local_1a0,&local_220);
  if ((char)iVar3 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x7fb,"ok");
  }
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  local_200.string_ = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"");
  paVar1 = &local_1d8.field_2;
  local_1d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1d8,local_220,local_220 + local_218);
  JsonTest::checkStringEqual
            (pTVar2,(string *)&local_200,&local_1d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x7fc,"\"\" == errs");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200.string_);
  }
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar4 = Json::Value::size(&local_1a0);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar2,2,AVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x7fd,"2u == root.size()");
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  Json::Value::Value((Value *)&local_200,true);
  Json::Value::get(&local_80,&local_1a0,"a",(Value *)&local_200);
  JsonTest::checkEqual<Json::ValueType,Json::Value>
            (pTVar2,nullValue,&local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x7fe,"Json::nullValue == root.get(\"a\", true)");
  Json::Value::~Value(&local_80);
  Json::Value::~Value((Value *)&local_200);
  local_1b8 = CONCAT17(local_1b8._7_1_,0x7d3a22000000);
  local_1b8 = CONCAT44(local_1b8._4_4_,0x2261227b);
  iVar3 = (*pCVar6->_vptr_CharReader[2])
                    (pCVar6,&local_1b8,(long)&local_1b8 + 6,&local_1a0,&local_220);
  if ((char)iVar3 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x805,"ok");
  }
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  local_200.string_ = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"");
  local_1d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1d8,local_220,local_220 + local_218);
  JsonTest::checkStringEqual
            (pTVar2,(string *)&local_200,&local_1d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x806,"\"\" == errs");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200.string_);
  }
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar4 = Json::Value::size(&local_1a0);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar2,1,AVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x807,"1u == root.size()");
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  Json::Value::Value((Value *)&local_200,true);
  Json::Value::get(&local_a8,&local_1a0,"a",(Value *)&local_200);
  JsonTest::checkEqual<Json::ValueType,Json::Value>
            (pTVar2,nullValue,&local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x808,"Json::nullValue == root.get(\"a\", true)");
  Json::Value::~Value(&local_a8);
  Json::Value::~Value((Value *)&local_200);
  local_200.uint_._2_6_ = (uint6)((ulong)local_200 >> 0x10) & 0xffffffffff00;
  local_200.int_._0_2_ = 0x5d5b;
  iVar3 = (*pCVar6->_vptr_CharReader[2])
                    (pCVar6,&local_200,(long)&local_200 + 2,&local_1a0,&local_220);
  if ((char)iVar3 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x80f,"ok");
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_220);
  if (iVar3 != 0) {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x810,"errs == \"\"");
  }
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar4 = Json::Value::size(&local_1a0);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar2,0,AVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x811,"0u == root.size()");
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  Json::Value::Value(&local_d0,&local_1a0);
  JsonTest::checkEqual<Json::ValueType,Json::Value>
            (pTVar2,arrayValue,&local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x812,"Json::arrayValue == root");
  Json::Value::~Value(&local_d0);
  local_200.int_._0_7_ = 0x5d6c6c000000;
  local_200.int_._0_4_ = 0x6c756e5b;
  iVar3 = (*pCVar6->_vptr_CharReader[2])
                    (pCVar6,&local_200,(long)&local_200 + 6,&local_1a0,&local_220);
  if ((char)iVar3 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x819,"ok");
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_220);
  if (iVar3 != 0) {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x81a,"errs == \"\"");
  }
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar4 = Json::Value::size(&local_1a0);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar2,1,AVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x81b,"1u == root.size()");
  local_1b8 = CONCAT44(local_1b8._4_4_,0x5d2c5b);
  iVar3 = (*pCVar6->_vptr_CharReader[2])
                    (pCVar6,&local_1b8,(long)&local_1b8 + 3,&local_1a0,&local_220);
  if ((char)iVar3 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x822,"ok");
  }
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  local_200.string_ = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"");
  local_1d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1d8,local_220,local_220 + local_218);
  JsonTest::checkStringEqual
            (pTVar2,(string *)&local_200,&local_1d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x823,"\"\" == errs");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200.string_);
  }
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar4 = Json::Value::size(&local_1a0);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar2,2,AVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x824,"2u == root.size()");
  local_1b8 = CONCAT26(local_1b8._6_2_,0x5d00000000);
  local_1b8 = CONCAT44(local_1b8._4_4_,0x2c2c2c5b);
  iVar3 = (*pCVar6->_vptr_CharReader[2])
                    (pCVar6,&local_1b8,(long)&local_1b8 + 5,&local_1a0,&local_220);
  if ((char)iVar3 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x82b,"ok");
  }
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  local_200.string_ = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"");
  local_1d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1d8,local_220,local_220 + local_218);
  JsonTest::checkStringEqual
            (pTVar2,(string *)&local_200,&local_1d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x82c,"\"\" == errs");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200.string_);
  }
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar4 = Json::Value::size(&local_1a0);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar2,4,AVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x82d,"4u == root.size()");
  local_1b8 = 0x5d2c6c6c756e5b;
  iVar3 = (*pCVar6->_vptr_CharReader[2])
                    (pCVar6,&local_1b8,(long)&local_1b8 + 7,&local_1a0,&local_220);
  if ((char)iVar3 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x834,"ok");
  }
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  local_200.string_ = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"");
  local_1d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1d8,local_220,local_220 + local_218);
  JsonTest::checkStringEqual
            (pTVar2,(string *)&local_200,&local_1d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x835,"\"\" == errs");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200.string_);
  }
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar4 = Json::Value::size(&local_1a0);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar2,2,AVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x836,"2u == root.size()");
  local_200.real_ = 6.546952731366453e-307;
  iVar3 = (*pCVar6->_vptr_CharReader[2])
                    (pCVar6,&local_200,(long)&local_200 + 7,&local_1a0,&local_220);
  if ((char)iVar3 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x83d,"ok");
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_220);
  if (iVar3 != 0) {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x83e,"errs == \"\"");
  }
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar4 = Json::Value::size(&local_1a0);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar2,2,AVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x83f,"2u == root.size()");
  local_1b8._4_4_ = (uint)((ulong)local_1b8 >> 0x20) & 0xffffff00;
  local_1b8 = CONCAT44(local_1b8._4_4_,0x5d2c2c5b);
  iVar3 = (*pCVar6->_vptr_CharReader[2])
                    (pCVar6,&local_1b8,(long)&local_1b8 + 4,&local_1a0,&local_220);
  if ((char)iVar3 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x846,"ok");
  }
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  local_200.string_ = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"");
  local_1d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1d8,local_220,local_220 + local_218);
  JsonTest::checkStringEqual
            (pTVar2,(string *)&local_200,&local_1d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x847,"\"\" == errs");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200.string_);
  }
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar4 = Json::Value::size(&local_1a0);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar2,3,AVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x848,"3u == root.size()");
  local_1b8 = 0x5d2c2c6c6c756e5b;
  uStack_1b0 = uStack_1b0 & 0xffffff00;
  iVar3 = (*pCVar6->_vptr_CharReader[2])(pCVar6,&local_1b8,&uStack_1b0,&local_1a0,&local_220);
  if ((char)iVar3 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x84f,"ok");
  }
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  local_200.string_ = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"");
  local_1d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1d8,local_220,local_220 + local_218);
  JsonTest::checkStringEqual
            (pTVar2,(string *)&local_200,&local_1d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x850,"\"\" == errs");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200.string_);
  }
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar4 = Json::Value::size(&local_1a0);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar2,3,AVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x851,"3u == root.size()");
  local_1b8 = 0x5d2c6c6c756e2c5b;
  uStack_1b0 = uStack_1b0 & 0xffffff00;
  iVar3 = (*pCVar6->_vptr_CharReader[2])(pCVar6,&local_1b8,&uStack_1b0,&local_1a0,&local_220);
  if ((char)iVar3 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x858,"ok");
  }
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  local_200.string_ = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"");
  local_1d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1d8,local_220,local_220 + local_218);
  JsonTest::checkStringEqual
            (pTVar2,(string *)&local_200,&local_1d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x859,"\"\" == errs");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200.string_);
  }
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar4 = Json::Value::size(&local_1a0);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar2,3,AVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x85a,"3u == root.size()");
  local_200.string_ = (char *)0x5d6c6c756e2c2c5b;
  local_1f8[0] = 0;
  iVar3 = (*pCVar6->_vptr_CharReader[2])(pCVar6,&local_200,local_1f8,&local_1a0,&local_220);
  if ((char)iVar3 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x861,"ok");
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_220);
  if (iVar3 != 0) {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x862,"errs == \"\"");
  }
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar4 = Json::Value::size(&local_1a0);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar2,3,AVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x863,"3u == root.size()");
  local_1b8 = 0x5d2c2c2c5d5b5b;
  iVar3 = (*pCVar6->_vptr_CharReader[2])
                    (pCVar6,&local_1b8,(long)&local_1b8 + 7,&local_1a0,&local_220);
  if ((char)iVar3 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x86a,"ok");
  }
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  local_200.string_ = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"");
  local_1d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1d8,local_220,local_220 + local_218);
  JsonTest::checkStringEqual
            (pTVar2,(string *)&local_200,&local_1d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x86b,"\"\" == errs");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200.string_);
  }
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar4 = Json::Value::size(&local_1a0);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar2,4,AVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x86c,"4u == root.size()");
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  pVVar5 = Json::Value::operator[](&local_1a0,0);
  Json::Value::Value(&local_f8,pVVar5);
  JsonTest::checkEqual<Json::ValueType,Json::Value>
            (pTVar2,arrayValue,&local_f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x86d,"Json::arrayValue == root[0u]");
  Json::Value::~Value(&local_f8);
  local_1b8 = 0x5d2c2c5d5b2c5b;
  iVar3 = (*pCVar6->_vptr_CharReader[2])
                    (pCVar6,&local_1b8,(long)&local_1b8 + 7,&local_1a0,&local_220);
  if ((char)iVar3 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x874,"ok");
  }
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  local_200.string_ = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"");
  local_1d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1d8,local_220,local_220 + local_218);
  JsonTest::checkStringEqual
            (pTVar2,(string *)&local_200,&local_1d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x875,"\"\" == errs");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200.string_);
  }
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar4 = Json::Value::size(&local_1a0);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar2,4,AVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x876,"4u == root.size()");
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  pVVar5 = Json::Value::operator[](&local_1a0,1);
  Json::Value::Value(&local_120,pVVar5);
  JsonTest::checkEqual<Json::ValueType,Json::Value>
            (pTVar2,arrayValue,&local_120,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x877,"Json::arrayValue == root[1u]");
  Json::Value::~Value(&local_120);
  local_200.real_ = 6.533856499361437e-307;
  iVar3 = (*pCVar6->_vptr_CharReader[2])
                    (pCVar6,&local_200,(long)&local_200 + 7,&local_1a0,&local_220);
  if ((char)iVar3 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x87e,"ok");
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_220);
  if (iVar3 != 0) {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x87f,"errs == \"\"");
  }
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar4 = Json::Value::size(&local_1a0);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar2,4,AVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x880,"4u == root.size()");
  pTVar2 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  pVVar5 = Json::Value::operator[](&local_1a0,3);
  Json::Value::Value(&local_148,pVVar5);
  JsonTest::checkEqual<Json::ValueType,Json::Value>
            (pTVar2,arrayValue,&local_148,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x881,"Json::arrayValue == root[3u]");
  Json::Value::~Value(&local_148);
  (*pCVar6->_vptr_CharReader[1])(pCVar6);
  if (local_220 != local_210) {
    operator_delete(local_220);
  }
  Json::Value::~Value(&local_1a0);
  Json::CharReaderBuilder::~CharReaderBuilder(&local_178);
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderAllowDropNullTest, issue178) {
  Json::CharReaderBuilder b;
  b.settings_["allowDroppedNullPlaceholders"] = true;
  Json::Value root;
  std::string errs;
  Json::CharReader* reader(b.newCharReader());
  {
    char const doc[] = "{\"a\":,\"b\":true}";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(2u, root.size());
    JSONTEST_ASSERT_EQUAL(Json::nullValue, root.get("a", true));
  }
  {
    char const doc[] = "{\"a\":}";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(1u, root.size());
    JSONTEST_ASSERT_EQUAL(Json::nullValue, root.get("a", true));
  }
  {
    char const doc[] = "[]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT(errs == "");
    JSONTEST_ASSERT_EQUAL(0u, root.size());
    JSONTEST_ASSERT_EQUAL(Json::arrayValue, root);
  }
  {
    char const doc[] = "[null]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT(errs == "");
    JSONTEST_ASSERT_EQUAL(1u, root.size());
  }
  {
    char const doc[] = "[,]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(2u, root.size());
  }
  {
    char const doc[] = "[,,,]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(4u, root.size());
  }
  {
    char const doc[] = "[null,]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(2u, root.size());
  }
  {
    char const doc[] = "[,null]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT(errs == "");
    JSONTEST_ASSERT_EQUAL(2u, root.size());
  }
  {
    char const doc[] = "[,,]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(3u, root.size());
  }
  {
    char const doc[] = "[null,,]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(3u, root.size());
  }
  {
    char const doc[] = "[,null,]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(3u, root.size());
  }
  {
    char const doc[] = "[,,null]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT(errs == "");
    JSONTEST_ASSERT_EQUAL(3u, root.size());
  }
  {
    char const doc[] = "[[],,,]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(4u, root.size());
    JSONTEST_ASSERT_EQUAL(Json::arrayValue, root[0u]);
  }
  {
    char const doc[] = "[,[],,]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(4u, root.size());
    JSONTEST_ASSERT_EQUAL(Json::arrayValue, root[1u]);
  }
  {
    char const doc[] = "[,,,[]]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT(errs == "");
    JSONTEST_ASSERT_EQUAL(4u, root.size());
    JSONTEST_ASSERT_EQUAL(Json::arrayValue, root[3u]);
  }
  delete reader;
}